

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  FILE *__stream;
  uint uVar3;
  int iVar4;
  int iVar5;
  FILE *fp_00;
  int *piVar6;
  char *pcVar7;
  EVP_PKEY *pkey_00;
  long lVar8;
  bool bVar9;
  ptls_iovec_t ocsp_status;
  long local_6c8;
  size_t i;
  ptls_key_exchange_algorithm_t *algo;
  int ret;
  EVP_PKEY *pkey;
  FILE *fp;
  int family;
  socklen_t salen;
  sockaddr_storage sa;
  int ch;
  int request_key_update;
  int use_early_data;
  int is_server;
  anon_struct_136_2_ecfa8f33 esni_key_exchanges;
  char *esni_file;
  char *file;
  char *port;
  char *host;
  ptls_handshake_properties_t hsprop;
  ptls_context_t ctx;
  ptls_key_exchange_algorithm_t *key_exchanges [128];
  char **argv_local;
  int argc_local;
  
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  __res_init();
  memset(&ctx.private_key_method,0,0x400);
  memset(&hsprop.collected_extensions,0,200);
  hsprop.collected_extensions = ptls_openssl_random_bytes;
  ctx.random_bytes = (_func_void_void_ptr_size_t *)&ptls_get_time;
  ctx.get_time = (ptls_get_time_t *)&ctx.private_key_method;
  ctx.key_exchanges = (ptls_key_exchange_algorithm_t **)ptls_openssl_cipher_suites;
  memset(&host,0,0x80);
  esni_file = (char *)0x0;
  esni_key_exchanges.count = 0;
  bVar9 = false;
  bVar2 = false;
  sa.__ss_align._4_4_ = 0;
  fp._0_4_ = 0;
  do {
    sa.__ss_align._0_4_ = getopt(argc,argv,"46abC:c:i:k:nN:es:SE:K:l:vh");
    if ((int)sa.__ss_align == -1) {
      iVar4 = argc - _optind;
      lVar8 = (long)_optind;
      if ((ctx.certificates.list == (ptls_iovec_t *)0x0) ==
          (ctx.emit_certificate == (ptls_emit_certificate_t *)0x0)) {
        if (bVar9) {
          if (ctx.certificates.list == (ptls_iovec_t *)0x0) {
            fprintf(_stderr,"-c and -k options must be set\n");
            return 1;
          }
          if (ctx.update_traffic_key != (ptls_update_traffic_key_t *)0x0) {
            ocsp_status = ptls_iovec_init((void *)0x0,0);
            iVar5 = ptls_init_compressed_certificate
                              (&main::ecc,(ptls_iovec_t *)ctx.cipher_suites,
                               (size_t)ctx.certificates.list,ocsp_status);
            if (iVar5 != 0) {
              fprintf(_stderr,
                      "failed to create a brotli-compressed version of the certificate chain.\n");
              exit(1);
            }
            ctx.on_client_hello = (ptls_on_client_hello_t *)&main::ecc;
          }
          setup_session_cache((ptls_context_t *)&hsprop.collected_extensions);
        }
        else if (bVar2) {
          hsprop.field_0.client.session_ticket.len = (size_t)&main::max_early_data_size;
        }
        if (ctx.private_key_method == (ptls_private_key_method_t *)0x0) {
          ctx.private_key_method = (ptls_private_key_method_t *)&ptls_openssl_secp256r1;
        }
        if (esni_key_exchanges.count != 0) {
          if (esni_key_exchanges.elements[0xf] == (ptls_key_exchange_context_t *)0x0) {
            fprintf(_stderr,"-E must be used together with -K\n");
            return 1;
          }
          setup_esni((ptls_context_t *)&hsprop.collected_extensions,(char *)esni_key_exchanges.count
                     ,(ptls_key_exchange_context_t **)&use_early_data);
        }
        if (iVar4 == 2) {
          pcVar1 = argv[lVar8];
          iVar4 = resolve_address((sockaddr *)&family,(socklen_t *)((long)&fp + 4),pcVar1,
                                  (argv + lVar8)[1],(int)fp,1,6);
          if (iVar4 != 0) {
            exit(1);
          }
          if (bVar9) {
            argv_local._4_4_ =
                 run_server((sockaddr *)&family,fp._4_4_,
                            (ptls_context_t *)&hsprop.collected_extensions,esni_file,
                            (ptls_handshake_properties_t *)&host,sa.__ss_align._4_4_);
          }
          else {
            argv_local._4_4_ =
                 run_client((sockaddr *)&family,fp._4_4_,
                            (ptls_context_t *)&hsprop.collected_extensions,pcVar1,esni_file,
                            (ptls_handshake_properties_t *)&host,sa.__ss_align._4_4_);
          }
        }
        else {
          fprintf(_stderr,"missing host and port\n");
          argv_local._4_4_ = 1;
        }
      }
      else {
        fprintf(_stderr,"-C/-c and -k options must be used together\n");
        argv_local._4_4_ = 1;
      }
      return argv_local._4_4_;
    }
    switch((int)sa.__ss_align) {
    case 0x34:
      fp._0_4_ = 2;
      break;
    default:
      exit(1);
    case 0x36:
      fp._0_4_ = 10;
      break;
    case 0x43:
    case 99:
      if (ctx.certificates.list != (ptls_iovec_t *)0x0) {
        fprintf(_stderr,"-C/-c can only be specified once\n");
        return 1;
      }
      load_certificate_chain((ptls_context_t *)&hsprop.collected_extensions,_optarg);
      bVar9 = (int)sa.__ss_align == 99;
      break;
    case 0x45:
      esni_key_exchanges.count = (size_t)_optarg;
      break;
    case 0x4b:
      fp_00 = fopen(_optarg,"rt");
      __stream = _stderr;
      pcVar1 = _optarg;
      if (fp_00 == (FILE *)0x0) {
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        fprintf(__stream,"failed to open ESNI private key file:%s:%s\n",pcVar1,pcVar7);
        return 1;
      }
      pkey_00 = PEM_read_PrivateKey(fp_00,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (pkey_00 == (EVP_PKEY *)0x0) {
        fprintf(_stderr,"failed to load private key from file:%s\n",_optarg);
        return 1;
      }
      lVar8 = (long)esni_key_exchanges.elements[0xf] * 2;
      esni_key_exchanges.elements[0xf] =
           (ptls_key_exchange_context_t *)((long)&esni_key_exchanges.elements[0xf]->algo + 1);
      uVar3 = ptls_openssl_create_key_exchange
                        ((ptls_key_exchange_context_t **)(&use_early_data + lVar8),
                         (EVP_PKEY *)pkey_00);
      if (uVar3 != 0) {
        fprintf(_stderr,"failed to load private key from file:%s:picotls-error:%d",_optarg,
                (ulong)uVar3);
        return 1;
      }
      EVP_PKEY_free(pkey_00);
      fclose(fp_00);
      break;
    case 0x4e:
      i = 0;
      iVar4 = strcasecmp(_optarg,"secp256r1");
      if (iVar4 == 0) {
        i = (size_t)&ptls_openssl_secp256r1;
      }
      if ((i == 0) && (iVar4 = strcasecmp(_optarg,"secp384r1"), iVar4 == 0)) {
        i = (size_t)&ptls_openssl_secp384r1;
      }
      if ((i == 0) && (iVar4 = strcasecmp(_optarg,"secp521r1"), iVar4 == 0)) {
        i = (size_t)&ptls_openssl_secp521r1;
      }
      if ((i == 0) && (iVar4 = strcasecmp(_optarg,"x25519"), iVar4 == 0)) {
        i = (size_t)&ptls_openssl_x25519;
      }
      if (i == 0) {
        fprintf(_stderr,"could not find key exchange: %s\n",_optarg);
        return 1;
      }
      for (local_6c8 = 0; key_exchanges[local_6c8 + -1] != (ptls_key_exchange_algorithm_t *)0x0;
          local_6c8 = local_6c8 + 1) {
      }
      key_exchanges[local_6c8 + -1] = (ptls_key_exchange_algorithm_t *)i;
      break;
    case 0x53:
      ctx.hkdf_label_prefix__obsolete._0_1_ = (byte)ctx.hkdf_label_prefix__obsolete & 0xfe | 1;
      break;
    case 0x61:
      ctx.hkdf_label_prefix__obsolete._0_1_ = (byte)ctx.hkdf_label_prefix__obsolete & 0xf7 | 8;
      break;
    case 0x62:
      ctx.update_traffic_key = (ptls_update_traffic_key_t *)&ptls_decompress_certificate;
      break;
    case 0x65:
      bVar2 = true;
      break;
    case 0x68:
      usage(*argv);
      exit(0);
    case 0x69:
      esni_file = _optarg;
      break;
    case 0x6b:
      load_private_key((ptls_context_t *)&hsprop.collected_extensions,_optarg);
      break;
    case 0x6c:
      setup_log_event((ptls_context_t *)&hsprop.collected_extensions,_optarg);
      break;
    case 0x6e:
      hsprop.field_0.server.selected_psk_binder.base[0x24] =
           hsprop.field_0.server.selected_psk_binder.base[0x24] & 0xfe | 1;
      break;
    case 0x73:
      setup_session_file((ptls_context_t *)&hsprop.collected_extensions,
                         (ptls_handshake_properties_t *)&host,_optarg);
      break;
    case 0x75:
      sa.__ss_align._4_4_ = 1;
      break;
    case 0x76:
      setup_verify_certificate((ptls_context_t *)&hsprop.collected_extensions);
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    res_init();

    ptls_key_exchange_algorithm_t *key_exchanges[128] = {NULL};
    ptls_context_t ctx = {ptls_openssl_random_bytes, &ptls_get_time, key_exchanges, ptls_openssl_cipher_suites};
    ptls_handshake_properties_t hsprop = {{{{NULL}}}};
    const char *host, *port, *file = NULL, *esni_file = NULL;
    struct {
        ptls_key_exchange_context_t *elements[16];
        size_t count;
    } esni_key_exchanges;
    int is_server = 0, use_early_data = 0, request_key_update = 0, ch;
    struct sockaddr_storage sa;
    socklen_t salen;
    int family = 0;

    while ((ch = getopt(argc, argv, "46abC:c:i:k:nN:es:SE:K:l:vh")) != -1) {
        switch (ch) {
        case '4':
            family = AF_INET;
            break;
        case '6':
            family = AF_INET6;
            break;
        case 'a':
            ctx.require_client_authentication = 1;
            break;
        case 'b':
#if PICOTLS_USE_BROTLI
            ctx.decompress_certificate = &ptls_decompress_certificate;
#else
            fprintf(stderr, "support for `-b` option was turned off during configuration\n");
            exit(1);
#endif
            break;
        case 'C':
        case 'c':
            if (ctx.certificates.count != 0) {
                fprintf(stderr, "-C/-c can only be specified once\n");
                return 1;
            }
            load_certificate_chain(&ctx, optarg);
            is_server = ch == 'c';
            break;
        case 'i':
            file = optarg;
            break;
        case 'k':
            load_private_key(&ctx, optarg);
            break;
        case 'n':
            hsprop.client.negotiate_before_key_exchange = 1;
            break;
        case 'e':
            use_early_data = 1;
            break;
        case 's':
            setup_session_file(&ctx, &hsprop, optarg);
            break;
        case 'S':
            ctx.require_dhe_on_psk = 1;
            break;
        case 'E':
            esni_file = optarg;
            break;
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;
            int ret;
            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open ESNI private key file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                return 1;
            }
            if ((ret = ptls_openssl_create_key_exchange(esni_key_exchanges.elements + esni_key_exchanges.count++, pkey)) != 0) {
                fprintf(stderr, "failed to load private key from file:%s:picotls-error:%d", optarg, ret);
                return 1;
            }
            EVP_PKEY_free(pkey);
            fclose(fp);
        } break;
        case 'l':
            setup_log_event(&ctx, optarg);
            break;
        case 'v':
            setup_verify_certificate(&ctx);
            break;
        case 'N': {
            ptls_key_exchange_algorithm_t *algo = NULL;
#define MATCH(name)                                                                                                                \
    if (algo == NULL && strcasecmp(optarg, #name) == 0)                                                                            \
    algo = (&ptls_openssl_##name)
            MATCH(secp256r1);
#if PTLS_OPENSSL_HAVE_SECP384R1
            MATCH(secp384r1);
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
            MATCH(secp521r1);
#endif
#if PTLS_OPENSSL_HAVE_X25519
            MATCH(x25519);
#endif
#undef MATCH
            if (algo == NULL) {
                fprintf(stderr, "could not find key exchange: %s\n", optarg);
                return 1;
            }
            size_t i;
            for (i = 0; key_exchanges[i] != NULL; ++i)
                ;
            key_exchanges[i++] = algo;
        } break;
        case 'u':
            request_key_update = 1;
            break;
        case 'h':
            usage(argv[0]);
            exit(0);
        default:
            exit(1);
        }
    }
    argc -= optind;
    argv += optind;
    if ((ctx.certificates.count == 0) != (ctx.sign_certificate == NULL)) {
        fprintf(stderr, "-C/-c and -k options must be used together\n");
        return 1;
    }
    if (is_server) {
        if (ctx.certificates.count == 0) {
            fprintf(stderr, "-c and -k options must be set\n");
            return 1;
        }
#if PICOTLS_USE_BROTLI
        if (ctx.decompress_certificate != NULL) {
            static ptls_emit_compressed_certificate_t ecc;
            if (ptls_init_compressed_certificate(&ecc, ctx.certificates.list, ctx.certificates.count, ptls_iovec_init(NULL, 0)) !=
                0) {
                fprintf(stderr, "failed to create a brotli-compressed version of the certificate chain.\n");
                exit(1);
            }
            ctx.emit_certificate = &ecc.super;
        }
#endif
        setup_session_cache(&ctx);
    } else {
        /* client */
        if (use_early_data) {
            static size_t max_early_data_size;
            hsprop.client.max_early_data_size = &max_early_data_size;
        }
    }
    if (key_exchanges[0] == NULL)
        key_exchanges[0] = &ptls_openssl_secp256r1;
    if (esni_file != NULL) {
        if (esni_key_exchanges.count == 0) {
            fprintf(stderr, "-E must be used together with -K\n");
            return 1;
        }
        setup_esni(&ctx, esni_file, esni_key_exchanges.elements);
    }
    if (argc != 2) {
        fprintf(stderr, "missing host and port\n");
        return 1;
    }
    host = (--argc, *argv++);
    port = (--argc, *argv++);

    if (resolve_address((struct sockaddr *)&sa, &salen, host, port, family, SOCK_STREAM, IPPROTO_TCP) != 0)
        exit(1);

    if (is_server) {
        return run_server((struct sockaddr *)&sa, salen, &ctx, file, &hsprop, request_key_update);
    } else {
        return run_client((struct sockaddr *)&sa, salen, &ctx, host, file, &hsprop, request_key_update);
    }
}